

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_13.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int *piVar2;
  long lVar3;
  int *prime;
  long lVar4;
  pointer piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *__src;
  int iVar9;
  int n;
  int local_5c;
  vector<int,_std::allocator<int>_> primes;
  
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  n = 0;
  std::operator<<((ostream *)&std::cout,"Enter amount of primes to find:\n");
  std::istream::operator>>((istream *)&std::cin,&n);
  for (local_5c = 2; local_5c < n * 10; local_5c = local_5c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(&primes,&local_5c);
  }
  piVar6 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + -1;
  lVar4 = -(long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  piVar2 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar5 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar8 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  while (lVar4 = lVar4 + -4, piVar8 = piVar8 + 1, piVar5 != piVar2) {
    piVar5 = piVar5 + 1;
    lVar3 = lVar4;
    piVar7 = piVar6;
    __src = piVar8;
    do {
      if ((piVar7[1] != *piVar5) && (piVar7[1] % *piVar5 == 0)) {
        if (__src != piVar2) {
          memmove(__src + -1,__src,(long)piVar2 + lVar3);
          piVar2 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        piVar2 = piVar2 + -1;
        primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar2;
      }
      piVar7 = piVar7 + 1;
      __src = __src + 1;
      lVar3 = lVar3 + -4;
    } while (piVar7 != piVar2);
    piVar6 = piVar6 + 1;
  }
  iVar9 = 0;
  for (piVar5 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar1,' ');
    if (iVar9 == n) break;
    iVar9 = iVar9 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&primes.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
	std::vector<int> primes;
	auto n = 0;
	std::cout << "Enter amount of primes to find:\n";
	std::cin >> n;
	for (auto i = 2; i < n * 10; ++i)
		primes.push_back(i);

	for (auto it = primes.begin(); it != primes.end();)
	{
		auto next = it++;
		for (;;)
		{
			if (*next != *it && *next % *it == 0)
				primes.erase(next);
			if (next == primes.end())
				break;
			++next;
		}
	}

	auto cnt = 0;
	for (auto&& prime : primes)
	{
		std::cout << prime << ' ';
		if (cnt == n)
			break;
		++cnt;
	}
	std::cout << std::endl;
	return 0;
}